

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TSymbol * __thiscall
glslang::TParseContext::redeclareBuiltinVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TQualifier *qualifier,
          TShaderQualifiers *publicType)

{
  EShLanguage EVar1;
  TLayoutDepth TVar2;
  TLayoutStencil TVar3;
  TSymbolTable *pTVar4;
  TIntermediate *pTVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  long lVar10;
  const_iterator cVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar13;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar14;
  byte bVar15;
  undefined8 uVar16;
  _func_int **pp_Var17;
  TSourceLoc *pTVar18;
  TSymbol *symbol;
  bool builtIn;
  TSymbol *local_80;
  bool local_71;
  TSourceLoc *local_70;
  undefined4 local_64;
  pool_allocator<char> local_60;
  key_type local_58;
  ulong uVar9;
  
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,0,3,"gl_");
  if (iVar7 != 0) {
    return (TSymbol *)0x0;
  }
  pTVar4 = (this->super_TParseContextBase).symbolTable;
  if (((long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0x20) {
    return (TSymbol *)0x0;
  }
  local_70 = loc;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x82) {
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_TexCoord");
      bVar6 = iVar7 == 0;
    }
  }
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    bVar15 = 1;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x140) {
      iVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                        (this,2,AEP_shader_io_blocks);
      bVar15 = (byte)iVar7;
    }
  }
  else {
    bVar15 = 0;
  }
  if ((bVar6 | bVar15) != 1) {
    return (TSymbol *)0x0;
  }
  local_64 = 0;
  if (((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile) &&
     ((this->super_TParseContextBase).super_TParseVersions.version < 0x8d)) {
    iVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_separate_shader_objects");
    if ((char)iVar7 == '\0') {
LAB_0042cea7:
      local_64 = 0;
    }
    else {
      uVar8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_Position");
      uVar9 = (ulong)uVar8;
      if (uVar8 != 0) {
        uVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_PointSize");
        uVar9 = (ulong)uVar8;
        if (uVar8 != 0) {
          uVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_ClipVertex");
          uVar9 = (ulong)uVar8;
          if (uVar8 != 0) {
            uVar8 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_FogFragCoord");
            uVar9 = (ulong)uVar8;
            if (uVar8 != 0) goto LAB_0042cea7;
          }
        }
      }
      local_64 = (undefined4)CONCAT71((int7)(uVar9 >> 8),1);
    }
  }
  if (((((((char)local_64 == '\0') &&
         ((iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_FragDepth"), iVar7 != 0 ||
          ((0x1a3 < (this->super_TParseContextBase).super_TParseVersions.version & bVar6) == 0 &&
           bVar15 == 0)))) &&
        ((iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_FragCoord"), iVar7 != 0 ||
         (bVar15 == 0 &&
          (0x8b < (this->super_TParseContextBase).super_TParseVersions.version & bVar6) == 0)))) &&
       ((((((iVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(identifier,"gl_ClipDistance"), iVar7 != 0 &&
            (iVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(identifier,"gl_CullDistance"), iVar7 != 0)) &&
           (iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_ShadingRateEXT"), iVar7 != 0)) &&
          ((iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_PrimitiveShadingRateEXT"), iVar7 != 0 &&
           (iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_FrontColor"), iVar7 != 0)))) &&
         (iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_BackColor"), iVar7 != 0)) &&
        (((iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_FrontSecondaryColor"), iVar7 != 0 &&
          (iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_BackSecondaryColor"), iVar7 != 0)) &&
         ((iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_SecondaryColor"), iVar7 != 0 &&
          ((iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_Color"), iVar7 != 0 ||
           ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment))))))))
       )) && ((iVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(identifier,"gl_FragStencilRefARB"), bVar6 != true || iVar7 != 0 ||
              (((this->super_TParseContextBase).super_TParseVersions.version < 0x8c ||
               ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment))))
             )) &&
     (((iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_SampleMask"), iVar7 != 0 &&
       (((iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_Layer"), iVar7 != 0 &&
         (iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_PrimitiveIndicesNV"), iVar7 != 0)) &&
        (iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_PrimitivePointIndicesEXT"), iVar7 != 0)))) &&
      (((iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_PrimitiveLineIndicesEXT"), iVar7 != 0 &&
        (iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_PrimitiveTriangleIndicesEXT"), iVar7 != 0)) &&
       (iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_TexCoord"), iVar7 != 0)))))) {
    return (TSymbol *)0x0;
  }
  local_80 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,&local_71,
                                (bool *)0x0,(int *)0x0);
  if (local_80 == (TSymbol *)0x0) {
    return (TSymbol *)0x0;
  }
  if (local_71 == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
              (this,&local_80);
    TSymbolTable::amendSymbolIdLevel((this->super_TParseContextBase).symbolTable,local_80);
  }
  iVar7 = (*local_80->_vptr_TSymbol[0xd])();
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x50))
                     ((long *)CONCAT44(extraout_var,iVar7));
  if ((char)local_64 == '\0') {
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_FrontColor");
    if (((iVar7 == 0) ||
        (iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_BackColor"), iVar7 == 0)) ||
       ((iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_FrontSecondaryColor"), iVar7 == 0 ||
        (((iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_BackSecondaryColor"), iVar7 == 0 ||
          (iVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_SecondaryColor"), iVar7 == 0)) ||
         (iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_Color"), iVar7 == 0)))))) {
      uVar13 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x80000000);
      uVar9 = *(ulong *)(lVar10 + 8);
      *(ulong *)(lVar10 + 8) = uVar9 & 0xffffffff7fffffff | uVar13;
      uVar12 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x40000000);
      *(ulong *)(lVar10 + 8) = uVar9 & 0xffffffff3fffffff | uVar13 | uVar12;
      *(ulong *)(lVar10 + 8) =
           uVar9 & 0xffffffdf3fffffff | uVar13 | uVar12 |
           *(ulong *)&qualifier->field_0x8 & 0x2000000000;
      bVar6 = TQualifier::hasNonXfbLayout(qualifier);
      pTVar18 = local_70;
      if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"cannot apply layout qualifier to","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_04,iVar7) + 8));
      }
      if ((*(ulong *)&qualifier->field_0x8 & 0x3fff18020000000) == 0) {
        iVar7 = (*local_80->_vptr_TSymbol[0xc])();
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x58))
                           ((long *)CONCAT44(extraout_var_05,iVar7));
        if (((*(uint *)&qualifier->field_0x8 ^ *(uint *)(lVar10 + 8)) & 0x7f) == 0) {
          return local_80;
        }
      }
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      uVar16 = *(undefined8 *)(CONCAT44(extraout_var_06,iVar7) + 8);
      pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar14 = "cannot change storage, memory, or auxiliary qualification of";
      goto LAB_0042d517;
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_TexCoord");
    pTVar18 = local_70;
    if (((iVar7 == 0) ||
        (iVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_ClipDistance"), iVar7 == 0)) ||
       (iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_CullDistance"), iVar7 == 0)) {
      bVar6 = TQualifier::hasNonXfbLayout(qualifier);
      if (((!bVar6) && (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) == 0x7fffffff))
         && (uVar9 = *(ulong *)&qualifier->field_0x8, (uVar9 & 0x3fff18020000000) == 0)) {
        uVar13 = *(ulong *)(lVar10 + 8) ^ uVar9;
        if (((uVar13 >> 0x25 & 1) == 0) &&
           (-1 < (int)*(ulong *)(lVar10 + 8) != (int)uVar9 < 0 && (uVar13 & 0x7f) == 0)) {
          return local_80;
        }
      }
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      uVar16 = *(undefined8 *)(CONCAT44(extraout_var_07,iVar7) + 8);
      pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar14 = "cannot change qualification of";
      goto LAB_0042d517;
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_FragCoord");
    if (iVar7 == 0) {
      pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (pTVar5->texCoordBuiltinRedeclared == false) {
        local_60.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_58,"gl_FragCoord",&local_60);
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                 ::find(&(pTVar5->ioAccessed)._M_t,&local_58);
        bVar6 = (_Rb_tree_header *)cVar11._M_node !=
                &(pTVar5->ioAccessed)._M_t._M_impl.super__Rb_tree_header;
      }
      else {
        bVar6 = false;
      }
      pTVar18 = local_70;
      if (bVar6) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_70,"cannot redeclare after use","gl_FragCoord","");
      }
      uVar9 = *(ulong *)&qualifier->field_0x8;
      if (((*(ulong *)(lVar10 + 8) ^ uVar9) >> 0x25 & 1) == 0) {
        if (((uVar9 & 0x3fff18020000000) == 0) &&
           ((int)uVar9 < 0 == (int)*(ulong *)(lVar10 + 8) < 0)) goto LAB_0042d7e8;
      }
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar18,"can only change layout qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_11,iVar7) + 8));
LAB_0042d7e8:
      if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 3) {
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"cannot change input storage qualification of","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_12,iVar7) + 8));
      }
      if ((local_71 == false) &&
         ((pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
          publicType->pixelCenterInteger != pTVar5->pixelCenterInteger ||
          (publicType->originUpperLeft != pTVar5->originUpperLeft)))) {
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"cannot redeclare with different qualification:","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_13,iVar7) + 8));
      }
      pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar5->texCoordBuiltinRedeclared = true;
      if (publicType->pixelCenterInteger == true) {
        pTVar5->pixelCenterInteger = true;
      }
      if (publicType->originUpperLeft == true) {
        pTVar5->originUpperLeft = true;
        return local_80;
      }
      return local_80;
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_FragDepth");
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_FragStencilRefARB");
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_PrimitiveIndicesNV");
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_SampleMask");
          if (iVar7 == 0) {
            if (publicType->layoutOverrideCoverage == false) {
              iVar7 = (*local_80->_vptr_TSymbol[3])();
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,local_70,"redeclaration only allowed for override_coverage layout",
                         "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_19,iVar7) + 8));
            }
            ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
            layoutOverrideCoverage = true;
            return local_80;
          }
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_Layer");
          if (iVar7 == 0) {
            if ((qualifier->layoutViewportRelative == false) &&
               (qualifier->layoutSecondaryViewportRelativeOffset == -0x800)) {
              iVar7 = (*local_80->_vptr_TSymbol[3])();
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,local_70,
                         "redeclaration only allowed for viewport_relative or secondary_view_offset layout"
                         ,"redeclaration",*(undefined8 *)(CONCAT44(extraout_var_03,iVar7) + 8));
            }
            *(bool *)(lVar10 + 0x30) = qualifier->layoutViewportRelative;
            *(int *)(lVar10 + 0x34) = qualifier->layoutSecondaryViewportRelativeOffset;
            return local_80;
          }
          return local_80;
        }
        bVar6 = TQualifier::hasNonXfbLayout(qualifier);
        if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
          iVar7 = (*local_80->_vptr_TSymbol[3])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,local_70,"cannot apply layout qualifier to","redeclaration",
                     *(undefined8 *)(CONCAT44(extraout_var_17,iVar7) + 8));
        }
        pTVar18 = local_70;
        if ((*(uint *)&qualifier->field_0x8 & 0x7f) == 4) {
          return local_80;
        }
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        uVar16 = *(undefined8 *)(CONCAT44(extraout_var_18,iVar7) + 8);
        pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar14 = "cannot change output storage qualification of";
        goto LAB_0042d517;
      }
      uVar9 = *(ulong *)&qualifier->field_0x8;
      if (((*(ulong *)(lVar10 + 8) ^ uVar9) >> 0x25 & 1) == 0) {
        if (((uVar9 & 0x3fff18020000000) != 0) ||
           ((int)uVar9 < 0 != (int)*(ulong *)(lVar10 + 8) < 0)) goto LAB_0042d8db;
      }
      else {
LAB_0042d8db:
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"can only change layout qualification of","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_14,iVar7) + 8));
      }
      if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 4) {
        iVar7 = (*local_80->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"cannot change output storage qualification of","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_15,iVar7) + 8));
      }
      if (publicType->layoutStencil == ElsNone) {
        return local_80;
      }
      pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      local_60.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"gl_FragStencilRefARB",&local_60);
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               ::find(&(pTVar5->ioAccessed)._M_t,&local_58);
      if ((_Rb_tree_header *)cVar11._M_node !=
          &(pTVar5->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,local_70,"cannot redeclare after use","gl_FragStencilRefARB","");
      }
      pTVar18 = local_70;
      pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar3 = pTVar5->stencilLayout;
      if (TVar3 == ElsNone) {
        pTVar5->stencilLayout = publicType->layoutStencil;
        return local_80;
      }
      if (TVar3 == publicType->layoutStencil) {
        return local_80;
      }
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      uVar16 = *(undefined8 *)(CONCAT44(extraout_var_16,iVar7) + 8);
      pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar14 = "all redeclarations must use the same stencil layout on";
      goto LAB_0042d517;
    }
    uVar9 = *(ulong *)&qualifier->field_0x8;
    if (((*(ulong *)(lVar10 + 8) ^ uVar9) >> 0x25 & 1) == 0) {
      if (((uVar9 & 0x3fff18020000000) != 0) || ((int)uVar9 < 0 != (int)*(ulong *)(lVar10 + 8) < 0))
      goto LAB_0042d5f7;
    }
    else {
LAB_0042d5f7:
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar18,"can only change layout qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_08,iVar7) + 8));
    }
    if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 4) {
      iVar7 = (*local_80->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar18,"cannot change output storage qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_09,iVar7) + 8));
    }
    if (publicType->layoutDepth == EldNone) {
      return local_80;
    }
    pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    local_60.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "gl_FragDepth",&local_60);
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ::find(&(pTVar5->ioAccessed)._M_t,&local_58);
    if ((_Rb_tree_header *)cVar11._M_node !=
        &(pTVar5->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,local_70,"cannot redeclare after use","gl_FragDepth","");
    }
    pTVar18 = local_70;
    pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar2 = pTVar5->depthLayout;
    if (TVar2 == EldNone) {
      pTVar5->depthLayout = publicType->layoutDepth;
      return local_80;
    }
    if (TVar2 == publicType->layoutDepth) {
      return local_80;
    }
    iVar7 = (*local_80->_vptr_TSymbol[3])();
    uVar16 = *(undefined8 *)(CONCAT44(extraout_var_10,iVar7) + 8);
    pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar14 = "all redeclarations must use the same depth layout on";
    goto LAB_0042d517;
  }
  pTVar5 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ::find(&(pTVar5->ioAccessed)._M_t,identifier);
  pTVar18 = local_70;
  if ((_Rb_tree_header *)cVar11._M_node != &(pTVar5->ioAccessed)._M_t._M_impl.super__Rb_tree_header)
  {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,local_70,"cannot redeclare after use",(identifier->_M_dataplus)._M_p,"");
  }
  bVar6 = TQualifier::hasNonXfbLayout(qualifier);
  if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
    iVar7 = (*local_80->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar18,"cannot apply layout qualifier to","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_00,iVar7) + 8));
  }
  if ((*(ulong *)&qualifier->field_0x8 & 0x3fff18020000000) == 0) {
    EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
    uVar8 = (uint)*(ulong *)&qualifier->field_0x8;
    if (((uVar8 & 0x7f) != 4 && EVar1 == EShLangVertex) ||
       ((uVar8 & 0x7f) != 3 && EVar1 == EShLangFragment)) goto LAB_0042cffe;
  }
  else {
LAB_0042cffe:
    iVar7 = (*local_80->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar18,"cannot change storage, memory, or auxiliary qualification of",
               "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 8));
  }
  if ((qualifier->field_0xb & 0x40) != 0) {
    return local_80;
  }
  iVar7 = (*local_80->_vptr_TSymbol[3])();
  uVar16 = *(undefined8 *)(CONCAT44(extraout_var_02,iVar7) + 8);
  pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar14 = "cannot change interpolation qualification of";
LAB_0042d517:
  (*pp_Var17[0x2d])(this,pTVar18,pcVar14,"redeclaration",uVar16);
  return local_80;
}

Assistant:

TSymbol* TParseContext::redeclareBuiltinVariable(const TSourceLoc& loc, const TString& identifier,
                                                 const TQualifier& qualifier, const TShaderQualifiers& publicType)
{
    if (! builtInName(identifier) || symbolTable.atBuiltInLevel() || ! symbolTable.atGlobalLevel())
        return nullptr;

    bool nonEsRedecls = (!isEsProfile() && (version >= 130 || identifier == "gl_TexCoord"));
    bool    esRedecls = (isEsProfile() &&
                         (version >= 320 || extensionsTurnedOn(Num_AEP_shader_io_blocks, AEP_shader_io_blocks)));
    if (! esRedecls && ! nonEsRedecls)
        return nullptr;

    // Special case when using GL_ARB_separate_shader_objects
    bool ssoPre150 = false;  // means the only reason this variable is redeclared is due to this combination
    if (!isEsProfile() && version <= 140 && extensionTurnedOn(E_GL_ARB_separate_shader_objects)) {
        if (identifier == "gl_Position"     ||
            identifier == "gl_PointSize"    ||
            identifier == "gl_ClipVertex"   ||
            identifier == "gl_FogFragCoord")
            ssoPre150 = true;
    }

    // Potentially redeclaring a built-in variable...

    if (ssoPre150 ||
        (identifier == "gl_FragDepth"           && ((nonEsRedecls && version >= 420) || esRedecls)) ||
        (identifier == "gl_FragCoord"           && ((nonEsRedecls && version >= 140) || esRedecls)) ||
         identifier == "gl_ClipDistance"                                                            ||
         identifier == "gl_CullDistance"                                                            ||
         identifier == "gl_ShadingRateEXT"                                                          ||
         identifier == "gl_PrimitiveShadingRateEXT"                                                 ||
         identifier == "gl_FrontColor"                                                              ||
         identifier == "gl_BackColor"                                                               ||
         identifier == "gl_FrontSecondaryColor"                                                     ||
         identifier == "gl_BackSecondaryColor"                                                      ||
         identifier == "gl_SecondaryColor"                                                          ||
        (identifier == "gl_Color"               && language == EShLangFragment)                     ||
        (identifier == "gl_FragStencilRefARB"   && (nonEsRedecls && version >= 140)
                                                && language == EShLangFragment)                     ||
         identifier == "gl_SampleMask"                                                              ||
         identifier == "gl_Layer"                                                                   ||
         identifier == "gl_PrimitiveIndicesNV"                                                      ||
         identifier == "gl_PrimitivePointIndicesEXT"                                                ||
         identifier == "gl_PrimitiveLineIndicesEXT"                                                 ||
         identifier == "gl_PrimitiveTriangleIndicesEXT"                                             ||
         identifier == "gl_TexCoord") {

        // Find the existing symbol, if any.
        bool builtIn;
        TSymbol* symbol = symbolTable.find(identifier, &builtIn);

        // If the symbol was not found, this must be a version/profile/stage
        // that doesn't have it.
        if (! symbol)
            return nullptr;

        // If it wasn't at a built-in level, then it's already been redeclared;
        // that is, this is a redeclaration of a redeclaration; reuse that initial
        // redeclaration.  Otherwise, make the new one.
        if (builtIn) {
            makeEditable(symbol);
            symbolTable.amendSymbolIdLevel(*symbol);
        }

        // Now, modify the type of the copy, as per the type of the current redeclaration.

        TQualifier& symbolQualifier = symbol->getWritableType().getQualifier();
        if (ssoPre150) {
            if (intermediate.inIoAccessed(identifier))
                error(loc, "cannot redeclare after use", identifier.c_str(), "");
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || (language == EShLangVertex   && qualifier.storage != EvqVaryingOut) ||
                                                                   (language == EShLangFragment && qualifier.storage != EvqVaryingIn))
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
            if (! qualifier.smooth)
                error(loc, "cannot change interpolation qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FrontColor"          ||
                   identifier == "gl_BackColor"           ||
                   identifier == "gl_FrontSecondaryColor" ||
                   identifier == "gl_BackSecondaryColor"  ||
                   identifier == "gl_SecondaryColor"      ||
                   identifier == "gl_Color") {
            symbolQualifier.flat = qualifier.flat;
            symbolQualifier.smooth = qualifier.smooth;
            symbolQualifier.nopersp = qualifier.nopersp;
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || symbol->getType().getQualifier().storage != qualifier.storage)
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_TexCoord"     ||
                   identifier == "gl_ClipDistance" ||
                   identifier == "gl_CullDistance") {
            if (qualifier.hasLayout() || qualifier.isMemory() || qualifier.isAuxiliary() ||
                qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                symbolQualifier.storage != qualifier.storage)
                error(loc, "cannot change qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FragCoord") {
            if (!intermediate.getTexCoordRedeclared() && intermediate.inIoAccessed("gl_FragCoord"))
                error(loc, "cannot redeclare after use", "gl_FragCoord", "");
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingIn)
                error(loc, "cannot change input storage qualification of", "redeclaration", symbol->getName().c_str());
            if (! builtIn && (publicType.pixelCenterInteger != intermediate.getPixelCenterInteger() ||
                              publicType.originUpperLeft != intermediate.getOriginUpperLeft()))
                error(loc, "cannot redeclare with different qualification:", "redeclaration", symbol->getName().c_str());


            intermediate.setTexCoordRedeclared();
            if (publicType.pixelCenterInteger)
                intermediate.setPixelCenterInteger();
            if (publicType.originUpperLeft)
                intermediate.setOriginUpperLeft();
        } else if (identifier == "gl_FragDepth") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutDepth != EldNone) {
                if (intermediate.inIoAccessed("gl_FragDepth"))
                    error(loc, "cannot redeclare after use", "gl_FragDepth", "");
                if (! intermediate.setDepth(publicType.layoutDepth))
                    error(loc, "all redeclarations must use the same depth layout on", "redeclaration", symbol->getName().c_str());
            }
        } else if (identifier == "gl_FragStencilRefARB") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutStencil != ElsNone) {
                if (intermediate.inIoAccessed("gl_FragStencilRefARB"))
                    error(loc, "cannot redeclare after use", "gl_FragStencilRefARB", "");
                if (!intermediate.setStencil(publicType.layoutStencil))
                    error(loc, "all redeclarations must use the same stencil layout on", "redeclaration",
                          symbol->getName().c_str());
            }
        }
        else if (
            identifier == "gl_PrimitiveIndicesNV") {
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
        }
        else if (identifier == "gl_SampleMask") {
            if (!publicType.layoutOverrideCoverage) {
                error(loc, "redeclaration only allowed for override_coverage layout", "redeclaration", symbol->getName().c_str());
            }
            intermediate.setLayoutOverrideCoverage();
        }
        else if (identifier == "gl_Layer") {
            if (!qualifier.layoutViewportRelative && qualifier.layoutSecondaryViewportRelativeOffset == -2048)
                error(loc, "redeclaration only allowed for viewport_relative or secondary_view_offset layout", "redeclaration", symbol->getName().c_str());
            symbolQualifier.layoutViewportRelative = qualifier.layoutViewportRelative;
            symbolQualifier.layoutSecondaryViewportRelativeOffset = qualifier.layoutSecondaryViewportRelativeOffset;
        }

        // TODO: semantics quality: separate smooth from nothing declared, then use IsInterpolation for several tests above

        return symbol;
    }

    return nullptr;
}